

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::MapToNeighSide<double>
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,int side,int SideDim,TPZVec<double> *InternalPar,
          TPZVec<double> *NeighPar,TPZFMatrix<double> *JacNeighSide)

{
  bool bVar1;
  TPZFMatrix<double> *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZVec<double> *in_RCX;
  int in_EDX;
  int64_t in_RDI;
  long *in_R8;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_R9;
  TPZTransform<double> tr;
  bool check;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> JacSide;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_stack_fffffffffffffce0;
  TPZVec<double> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  TPZSavable in_stack_fffffffffffffd00;
  TPZVec<double> *in_stack_fffffffffffffd08;
  TPZSavable in_stack_fffffffffffffd10;
  TPZBaseMatrix local_110 [7];
  TPZGeoBlend<pzgeom::TPZGeoPoint> *local_30;
  long *local_28;
  TPZVec<double> *local_20;
  int local_18;
  int local_14 [4];
  byte local_1;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffd00._vptr_TPZSavable,in_RDI);
  bVar1 = pztopology::TPZPoint::CheckProjectionForSingularity<double>(local_14,local_20);
  pztopology::TPZPoint::MapToSide<double>
            (CONCAT13(bVar1,(int3)in_stack_fffffffffffffcf4),in_stack_fffffffffffffce8,
             (TPZVec<double> *)in_stack_fffffffffffffce0,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if (bVar1) {
    (**(code **)(*local_28 + 0x18))(local_28,(long)local_18);
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)in_stack_fffffffffffffd00._vptr_TPZSavable);
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,(TPZTransform<double> *)0x1660c95
              );
    TPZTransform<double>::Apply
              ((TPZTransform<double> *)in_stack_fffffffffffffd10._vptr_TPZSavable,
               in_stack_fffffffffffffd08,
               (TPZVec<double> *)in_stack_fffffffffffffd00._vptr_TPZSavable);
    (*(local_30->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
      super_TPZSavable._vptr_TPZSavable[0xd])(local_30,0);
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,(TPZTransform<double> *)0x1660ce3
              );
    in_stack_fffffffffffffce0 = local_30;
    pTVar2 = TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)pTVar2);
    iVar4 = TPZBaseMatrix::Cols(local_110);
    (*(in_stack_fffffffffffffce0->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.
      super_TPZPoint.super_TPZSavable._vptr_TPZSavable[0xd])(in_stack_fffffffffffffce0,iVar3,iVar4);
    pTVar2 = TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (pTVar2,local_110,local_30,0);
    local_1 = 1;
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1660d78);
  }
  else {
    local_1 = 0;
  }
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffce0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1660db4);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }